

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractMajor.hpp
# Opt level: O1

void __thiscall AbstractMajor::getRequirements(AbstractMajor *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  long *plVar3;
  istream *piVar4;
  invalid_argument *this_00;
  ulong *puVar5;
  size_type *psVar6;
  string temp;
  ifstream fin;
  value_type local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_238 [65];
  
  std::operator+(&local_258,"major/",&this->name);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_258);
  paVar1 = &local_278.field_2;
  puVar5 = (ulong *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar5) {
    local_278.field_2._M_allocated_capacity = *puVar5;
    local_278.field_2._8_8_ = plVar3[3];
    local_278._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_278.field_2._M_allocated_capacity = *puVar5;
    local_278._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_278._M_string_length = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::ifstream::ifstream((istream *)local_238,(string *)&local_278,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar1) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    local_278._M_string_length = 0;
    local_278.field_2._M_allocated_capacity =
         local_278.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_278._M_dataplus._M_p = (pointer)paVar1;
    while( true ) {
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_278,cVar2);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->requiredCourses,&local_278);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar1) {
      operator_delete(local_278._M_dataplus._M_p);
    }
    std::ifstream::~ifstream(local_238);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_258,"Error, requirements file for ",&this->name);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_278._M_dataplus._M_p = (pointer)*plVar3;
  psVar6 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_278._M_dataplus._M_p == psVar6) {
    local_278.field_2._M_allocated_capacity = *psVar6;
    local_278.field_2._8_8_ = plVar3[3];
    local_278._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_278.field_2._M_allocated_capacity = *psVar6;
  }
  local_278._M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::invalid_argument::invalid_argument(this_00,(string *)&local_278);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void getRequirements() {
            ifstream fin("major/" + this->name + ".txt");
            
            if (!fin.is_open()) {
                throw std::invalid_argument("Error, requirements file for " + this->name + " not found.");
            }
            string temp;

            while(getline(fin, temp)) {
                requiredCourses.push_back(temp);
            }
        }